

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O3

void UnaryExpression_minus_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  JsValue *res_00;
  undefined1 local_50 [8];
  JsValue r1;
  JsValue r2;
  
  (*JsNodeClassEval[(*(JsAstNode **)(na + 1))->astClass])
            (*(JsAstNode **)(na + 1),context,(JsValue *)local_50);
  res_00 = (JsValue *)((long)&r1.u + 8);
  JsGetValue((JsValue *)local_50,res_00);
  JsToNumber(res_00,res);
  res->type = JS_NUMBER;
  (res->u).object = (JsObject *)((ulong)(res->u).object ^ 0x8000000000000000);
  return;
}

Assistant:

static void
UnaryExpression_minus_eval(na, context, res)
	struct JsAstNode *na; /* (struct JsAstUnaryNode) */
	struct JsContext *context;
	struct JsValue *res;
{
	struct JsAstUnaryNode *n = CAST_NODE(na, JsAstUnaryNode);
	struct JsValue r1, r2;

	EVAL(n->a, context, &r1);
	JsGetValue( &r1, &r2);
	JsToNumber( &r2, res);
	res->type =JS_NUMBER;
	res->u.number = -(res->u.number);
}